

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_getter.cpp
# Opt level: O2

void GetAllCaptureMovements(Situation *situation,int *num_of_all_movements,Movement *all_movements)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int (*paiVar13) [10];
  long lVar14;
  long lVar15;
  
  uVar4 = situation->current_player;
  lVar6 = (long)(int)uVar4;
  iVar10 = uVar4 * 0x10;
  iVar7 = *num_of_all_movements;
  lVar12 = (long)iVar10;
  lVar14 = lVar12 + 0x10;
  for (lVar15 = lVar14; lVar15 <= iVar10 + 0x10; lVar15 = lVar15 + 1) {
    bVar1 = situation->current_pieces[lVar15];
    if ((ulong)bVar1 != 0) {
      paiVar13 = KING_CAN_GET[bVar1] + lVar6;
      while( true ) {
        iVar5 = (*paiVar13)[0];
        if ((long)iVar5 == 0) break;
        bVar2 = situation->current_board[iVar5];
        if ((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) {
          all_movements[iVar7].capture = bVar2;
          all_movements[iVar7].from = bVar1;
          all_movements[iVar7].to = (UINT8)iVar5;
          all_movements[iVar7].catc = '\0';
          all_movements[iVar7].movec = '\0';
          iVar7 = iVar7 + 1;
          *num_of_all_movements = iVar7;
        }
        paiVar13 = (int (*) [10])(*paiVar13 + 1);
      }
    }
  }
  while (lVar14 < iVar10 + 0x12) {
    bVar1 = situation->current_pieces[lVar14 + 1];
    lVar14 = lVar14 + 1;
    if ((ulong)bVar1 != 0) {
      paiVar13 = ADVISOR_CAN_GET[bVar1] + lVar6;
      while( true ) {
        iVar5 = (*paiVar13)[0];
        if ((long)iVar5 == 0) break;
        bVar2 = situation->current_board[iVar5];
        if ((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) {
          all_movements[iVar7].capture = bVar2;
          all_movements[iVar7].from = bVar1;
          all_movements[iVar7].to = (UINT8)iVar5;
          all_movements[iVar7].catc = '\0';
          all_movements[iVar7].movec = '\0';
          iVar7 = iVar7 + 1;
          *num_of_all_movements = iVar7;
        }
        paiVar13 = (int (*) [10])(*paiVar13 + 1);
      }
    }
  }
  for (lVar14 = lVar12 + 0x13; lVar14 <= iVar10 + 0x14; lVar14 = lVar14 + 1) {
    bVar1 = situation->current_pieces[lVar14];
    if ((ulong)bVar1 != 0) {
      lVar15 = (ulong)bVar1 * 0x50 + lVar6 * 0x28;
      while( true ) {
        iVar5 = *(int *)((long)BISHOP_CAN_GET[0][0] + lVar15);
        if ((long)iVar5 == 0) break;
        bVar2 = situation->current_board[iVar5];
        if (((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) &&
           (situation->current_board[*(int *)((long)BISHOP_EYE[0][0] + lVar15)] == '\0')) {
          all_movements[iVar7].capture = bVar2;
          all_movements[iVar7].from = bVar1;
          all_movements[iVar7].to = (UINT8)iVar5;
          all_movements[iVar7].catc = '\0';
          all_movements[iVar7].movec = '\0';
          iVar7 = iVar7 + 1;
          *num_of_all_movements = iVar7;
        }
        lVar15 = lVar15 + 4;
      }
    }
  }
  for (lVar14 = lVar12 + 0x15; lVar14 <= iVar10 + 0x16; lVar14 = lVar14 + 1) {
    bVar1 = situation->current_pieces[lVar14];
    if ((ulong)bVar1 != 0) {
      lVar15 = (ulong)bVar1 * 0x28;
      while( true ) {
        iVar5 = *(int *)((long)HORSE_CAN_GET[0] + lVar15);
        if ((long)iVar5 == 0) break;
        bVar2 = situation->current_board[iVar5];
        if (((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) &&
           (situation->current_board[*(int *)((long)HORSE_LEG[0] + lVar15)] == '\0')) {
          all_movements[iVar7].capture = bVar2;
          all_movements[iVar7].from = bVar1;
          all_movements[iVar7].to = (UINT8)iVar5;
          all_movements[iVar7].catc = '\0';
          all_movements[iVar7].movec = '\0';
          iVar7 = iVar7 + 1;
          *num_of_all_movements = iVar7;
        }
        lVar15 = lVar15 + 4;
      }
    }
  }
  for (lVar14 = lVar12 + 0x17; lVar14 <= iVar10 + 0x18; lVar14 = lVar14 + 1) {
    bVar1 = situation->current_pieces[lVar14];
    if (bVar1 != 0) {
      uVar8 = bVar1 & 0xf;
      uVar3 = situation->bit_row[(uint)(bVar1 >> 4)];
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        bVar2 = *(byte *)((ulong)((bVar1 & 0xf) << 0xc) + (ulong)uVar3 * 8 + 0x304d42 + lVar15);
        if (uVar8 != bVar2) {
          uVar9 = (ulong)bVar2 | (ulong)(bVar1 & 0xfffffff0);
          bVar2 = situation->current_board[uVar9];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar7].capture = bVar2;
            all_movements[iVar7].from = bVar1;
            all_movements[iVar7].to = (UINT8)uVar9;
            all_movements[iVar7].catc = '\0';
            all_movements[iVar7].movec = '\0';
            iVar7 = iVar7 + 1;
            *num_of_all_movements = iVar7;
          }
        }
      }
      uVar3 = situation->bit_col[uVar8];
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        bVar2 = *(byte *)((ulong)((bVar1 & 0xf0) << 9) + (ulong)uVar3 * 8 + 0x30ad42 + lVar15);
        if ((uint)(bVar1 >> 4) != (uint)bVar2) {
          uVar11 = (uint)bVar2 << 4 | uVar8;
          bVar2 = situation->current_board[uVar11];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar7].capture = bVar2;
            all_movements[iVar7].from = bVar1;
            all_movements[iVar7].movec = '\0';
            all_movements[iVar7].to = (UINT8)uVar11;
            iVar7 = iVar7 + 1;
            *num_of_all_movements = iVar7;
          }
        }
      }
    }
  }
  for (lVar14 = lVar12 + 0x19; lVar14 <= iVar10 + 0x1a; lVar14 = lVar14 + 1) {
    bVar1 = situation->current_pieces[lVar14];
    if (bVar1 != 0) {
      uVar8 = bVar1 & 0xf;
      uVar3 = situation->bit_row[(uint)(bVar1 >> 4)];
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        bVar2 = *(byte *)((ulong)((bVar1 & 0xf) << 0xc) + (ulong)uVar3 * 8 + 0x304d44 + lVar15);
        if (uVar8 != bVar2) {
          uVar9 = (ulong)bVar2 | (ulong)(bVar1 & 0xfffffff0);
          bVar2 = situation->current_board[uVar9];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar7].capture = bVar2;
            all_movements[iVar7].from = bVar1;
            all_movements[iVar7].to = (UINT8)uVar9;
            all_movements[iVar7].catc = '\0';
            all_movements[iVar7].movec = '\0';
            iVar7 = iVar7 + 1;
            *num_of_all_movements = iVar7;
          }
        }
      }
      uVar3 = situation->bit_col[uVar8];
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        bVar2 = *(byte *)((ulong)((bVar1 & 0xf0) << 9) + (ulong)uVar3 * 8 + 0x30ad44 + lVar15);
        if ((uint)(bVar1 >> 4) != (uint)bVar2) {
          uVar11 = (uint)bVar2 << 4 | uVar8;
          bVar2 = situation->current_board[uVar11];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar7].capture = bVar2;
            all_movements[iVar7].from = bVar1;
            all_movements[iVar7].to = (UINT8)uVar11;
            all_movements[iVar7].catc = '\0';
            all_movements[iVar7].movec = '\0';
            iVar7 = iVar7 + 1;
            *num_of_all_movements = iVar7;
          }
        }
      }
    }
  }
  for (lVar12 = lVar12 + 0x1b; lVar12 <= iVar10 + 0x1f; lVar12 = lVar12 + 1) {
    bVar1 = situation->current_pieces[lVar12];
    if ((ulong)bVar1 != 0) {
      paiVar13 = PAWN_CAN_GET[bVar1] + lVar6;
      while( true ) {
        iVar5 = (*paiVar13)[0];
        if ((long)iVar5 == 0) break;
        bVar2 = situation->current_board[iVar5];
        if ((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) {
          all_movements[iVar7].capture = bVar2;
          all_movements[iVar7].from = bVar1;
          all_movements[iVar7].to = (UINT8)iVar5;
          all_movements[iVar7].catc = '\0';
          all_movements[iVar7].movec = '\0';
          iVar7 = iVar7 + 1;
          *num_of_all_movements = iVar7;
        }
        paiVar13 = (int (*) [10])(*paiVar13 + 1);
      }
    }
  }
  return;
}

Assistant:

void GetAllCaptureMovements(const Situation & situation, int & num_of_all_movements, Movement* all_movements){
    // 1. 获得玩家特征值 
    int player_flag = GetPlayerFlag(situation.current_player), player = situation.current_player;
    int piece_from, piece_to, can_move_counter, piece_to_id;
    // 2. 将(帅)的吃子着法
    for(int i = player_flag + 0; i <= player_flag + 0; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = KING_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = KING_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }

    // 3. 士(仕)的吃子着法
    for(int i = player_flag + 1; i <= player_flag + 2; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = ADVISOR_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = ADVISOR_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }
    // 4. 象(相)的吃子着法
    for(int i = player_flag + 3; i <= player_flag + 4; i ++){
        if(situation.current_pieces[i] != 0){
            int bishop_eye;                  // 象眼位置
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = BISHOP_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                bishop_eye = BISHOP_EYE[piece_from][player][can_move_counter];
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player && situation.current_board[bishop_eye] == 0){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = BISHOP_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }

    // 5. 马的吃子着法
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        if(situation.current_pieces[i] != 0){
            int horse_leg;                  // 马腿位置
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = HORSE_CAN_GET[piece_from][can_move_counter];
            while(piece_to != 0){
                horse_leg = HORSE_LEG[piece_from][can_move_counter];
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player && situation.current_board[horse_leg] == 0){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].movec = 0;
                    all_movements[num_of_all_movements].catc = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = HORSE_CAN_GET[piece_from][can_move_counter];
            }
        }
    }

    // 6. 车的吃子着法
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            int col = GetCol(piece_from), row = GetRow(piece_from);

            // 右 左 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_col = ROOK_CANNON_CAN_GET_ROW[col - 3][situation.bit_row[row]].rook_capture[j];
                if(capture_col != col){
                    piece_to = GetPosition(capture_col, row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
            // 下 上 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_row = ROOK_CANNON_CAN_GET_COL[row - 3][situation.bit_col[col]].rook_capture[j];
                if(capture_row != row){
                    piece_to = GetPosition(col, capture_row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].movec = 0;
                        all_movements[num_of_all_movements].to = piece_to;
                        num_of_all_movements ++;
                    }
                }
            }
        
        }
    }
    
    // 7. 炮的吃子着法
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            int col = GetCol(piece_from), row = GetRow(piece_from);

            // 右 左 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_col = ROOK_CANNON_CAN_GET_ROW[col - 3][situation.bit_row[row]].cannon_capture[j];
                if(capture_col != col){
                    piece_to = GetPosition(capture_col, row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
            // 下 上 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_row = ROOK_CANNON_CAN_GET_COL[row - 3][situation.bit_col[col]].cannon_capture[j];
                if(capture_row != row){
                    piece_to = GetPosition(col, capture_row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
        
        }
    }

    // 8. 兵(卒)的吃子着法
    for(int i = player_flag + 11; i <= player_flag + 15; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = PAWN_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = PAWN_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }
}